

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int read_Bools(archive_read *a,uchar *data,size_t num)

{
  byte *pbVar1;
  ulong in_RDX;
  archive_read *in_RSI;
  uint avail;
  uint mask;
  uint i;
  uchar *p;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  local_30 = 0;
  local_34 = 0;
  local_2c = 0;
  do {
    if (in_RDX <= local_2c) {
      return 0;
    }
    if (local_30 == 0) {
      pbVar1 = header_bytes(in_RSI,in_RDX);
      if (pbVar1 == (byte *)0x0) {
        return -1;
      }
      local_34 = (uint)*pbVar1;
      local_30 = 0x80;
    }
    *(bool *)((long)&(in_RSI->archive).magic + (ulong)local_2c) = (local_34 & local_30) != 0;
    local_30 = local_30 >> 1;
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

static int
read_Bools(struct archive_read *a, unsigned char *data, size_t num)
{
	const unsigned char *p;
	unsigned i, mask = 0, avail = 0;

	for (i = 0; i < num; i++) {
		if (mask == 0) {
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			avail = *p;
			mask = 0x80;
		}
		data[i] = (avail & mask)?1:0;
		mask >>= 1;
	}
	return (0);
}